

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<TxInUndoFormatter>::Ser<SizeComputer,std::vector<Coin,std::allocator<Coin>>>
          (VectorFormatter<TxInUndoFormatter> *this,SizeComputer *s,
          vector<Coin,_std::allocator<Coin>_> *v)

{
  pointer pCVar1;
  ulong uVar2;
  long lVar3;
  const_iterator __end0;
  const_iterator __begin0;
  pointer txout;
  long in_FS_OFFSET;
  TxInUndoFormatter formatter;
  TxInUndoFormatter local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  txout = (v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  pCVar1 = (v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar2 = ((long)pCVar1 - (long)txout >> 4) * -0x5555555555555555;
  lVar3 = 1;
  if ((0xfc < uVar2) && (lVar3 = 3, 0xffff < uVar2)) {
    lVar3 = (ulong)(uVar2 >> 0x20 != 0) * 4 + 5;
  }
  s->nSize = s->nSize + lVar3;
  if (txout != pCVar1) {
    do {
      TxInUndoFormatter::Ser<SizeComputer>(&local_29,s,txout);
      txout = txout + 1;
    } while (txout != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }